

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDetailView.cpp
# Opt level: O0

void __thiscall RoomDetailView::display(RoomDetailView *this)

{
  display((RoomDetailView *)&this[-1].super_DetailView<Room>.super_View.menuChoices);
  return;
}

Assistant:

void RoomDetailView::display() {
    cout << "Enter room number to get details for: \n";
    int roomNumber = Input::getInt();
    Room *room = Room::findByRoomNumber(roomNumber);
    if (room) {
        cout << "Details for room #" << room->getRoomNumber() << "\n\tStrength: " << room->getStrength()
             << "\n\tAudio: ";
        if (room->hasVideo()) cout << "Yes"; else cout << "No";
        cout << "\n\tVideo: ";
        if (room->hasVideo()) cout << "Yes"; else cout << "No";
        cout << endl;
    } else {
        cout << "Room #" << roomNumber << " doesn't exist.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}